

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * CTcPrsOpUnary::parse_delegated(void)

{
  CTcPrsNode *pCVar1;
  CTcPrsNode *lhs;
  CTcPrsNode *target;
  CTcPrsNode *in_stack_00000058;
  CTPNDelegated *in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  
  CTcParser::set_self_referenced(G_prs,1);
  CTcTokenizer::next((CTcTokenizer *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  parse_postfix(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
  pCVar1 = (CTcPrsNode *)CTcPrsAllocObj::operator_new(0x25a58f);
  CTPNDelegated::CTPNDelegated(in_stack_ffffffffffffffe0,pCVar1);
  pCVar1 = parse_member(in_stack_00000058);
  return pCVar1;
}

Assistant:

CTcPrsNode *CTcPrsOpUnary::parse_delegated()
{
    /* 'delegated' always references 'self' */
    G_prs->set_self_referenced(TRUE);

    /* skip the "delegated" keyword */
    G_tok->next();

    /* 
     *   Parse a postfix expression giving the delegatee.  Don't allow
     *   nested member subexpressions (unless they're enclosed in
     *   parentheses, of course) - our implicit '.' postfix takes
     *   precedence.  Also, don't allow call subexpressions (unless enclosed
     *   in parens), since a postfix argument list binds to the 'delegated'
     *   expression, not to a subexpression involving a function/method
     *   call.  
     */
    CTcPrsNode *target = parse_postfix(FALSE, FALSE);

    /* set up the "delegated" node */
    CTcPrsNode *lhs = new CTPNDelegated(target);

    /* return the rest as a normal member expression */
    return parse_member(lhs);
}